

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
::insert<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>&>
          (HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
           *this,vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                 *args)

{
  undefined8 *puVar1;
  byte bVar2;
  u8 uVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  u8 local_61;
  ulong local_60;
  _Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_> local_58
  ;
  ulong local_38;
  ulong local_30;
  
  std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>::vector
            ((vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_> *)
             &local_58,args);
  bVar5 = HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
          ::findPosition((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                          *)this,(KeyType *)&local_58,&local_61,&local_30,&local_38,&local_60);
  if (bVar5) {
    bVar5 = false;
  }
  else {
    uVar6 = *(ulong *)(this + 0x10);
    if (*(ulong *)(this + 0x20) != uVar6 * 7 + 7 >> 3) {
      if (local_60 != local_38) {
        lVar4 = *(long *)this;
        *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
        uVar7 = local_38;
        do {
          bVar2 = *(byte *)(*(long *)(this + 8) + local_60);
          if (-1 < (char)bVar2) {
            *(u8 *)(*(long *)(this + 8) + local_60) = local_61;
            puVar1 = (undefined8 *)(lVar4 + local_60 * 0x18);
            *puVar1 = local_58._M_impl.super__Vector_impl_data._M_start;
            puVar1[1] = local_58._M_impl.super__Vector_impl_data._M_finish;
            *(pointer *)(lVar4 + 0x10 + local_60 * 0x18) =
                 local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar5 = true;
            goto LAB_002d07d8;
          }
          uVar8 = (ulong)((int)local_60 - (uint)bVar2 & 0x7f);
          if (uVar8 < (local_60 - local_30 & uVar6)) {
            std::
            swap<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                      ((HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                        *)&local_58,
                       (HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                        *)(local_60 * 0x18 + lVar4));
            uVar3 = *(u8 *)(*(long *)(this + 8) + local_60);
            *(u8 *)(*(long *)(this + 8) + local_60) = local_61;
            uVar6 = *(ulong *)(this + 0x10);
            local_30 = local_60 - uVar8 & uVar6;
            uVar7 = local_30 + 0x7f & uVar6;
            local_61 = uVar3;
            local_38 = uVar7;
          }
          local_60 = local_60 + 1 & uVar6;
        } while (local_60 != uVar7);
        HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
        ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                     *)this);
        bVar5 = true;
        insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                  (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                         *)&local_58);
        goto LAB_002d07d8;
      }
    }
    HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
    ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                 *)this);
    bVar5 = insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                      (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                             *)&local_58);
  }
LAB_002d07d8:
  std::_Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>::
  ~_Vector_base(&local_58);
  return bVar5;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }